

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ELiteralSelector.cpp
# Opt level: O1

LiteralList * __thiscall
Kernel::ELiteralSelector::getMaximalsInOrder(ELiteralSelector *this,Clause *c,uint eligible)

{
  Literal *pLVar1;
  bool bVar2;
  LiteralList *pLVar3;
  ulong uVar4;
  LiteralList *local_40;
  ELiteralSelector *local_38;
  
  local_40 = (LiteralList *)0x0;
  local_38 = this;
  if (0 < (int)eligible) {
    uVar4 = (ulong)eligible;
    do {
      pLVar3 = local_40;
      pLVar1 = c->_literals[uVar4 - 1];
      local_40 = (LiteralList *)
                 ::Lib::FixedSizeAllocator<16UL>::alloc
                           ((FixedSizeAllocator<16UL> *)
                            (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      local_40->_head = pLVar1;
      local_40->_tail = pLVar3;
      bVar2 = 1 < (long)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar2);
  }
  Ordering::removeNonMaximal((local_38->super_LiteralSelector)._ord,&local_40);
  return local_40;
}

Assistant:

LiteralList* ELiteralSelector::getMaximalsInOrder(Clause* c, unsigned eligible)
{
  LiteralList* res = LiteralList::empty();

  for(int li=((int)eligible)-1; li>=0; li--) {
    LiteralList::push((*c)[li],res);
  }

  _ord.removeNonMaximal(res);

  return res;
}